

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_formparse.c
# Opt level: O2

tool_mime * tool_mime_new(tool_mime *parent,toolmimekind kind)

{
  tool_mime *ptVar1;
  
  ptVar1 = (tool_mime *)calloc(1,0x70);
  if (ptVar1 != (tool_mime *)0x0) {
    ptVar1->kind = kind;
    ptVar1->parent = parent;
    if (parent != (tool_mime *)0x0) {
      ptVar1->prev = parent->subparts;
      parent->subparts = ptVar1;
    }
  }
  return ptVar1;
}

Assistant:

static tool_mime *tool_mime_new(tool_mime *parent, toolmimekind kind)
{
  tool_mime *m = (tool_mime *) calloc(1, sizeof(*m));

  if(m) {
    m->kind = kind;
    m->parent = parent;
    if(parent) {
      m->prev = parent->subparts;
      parent->subparts = m;
    }
  }
  return m;
}